

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O1

int_mv av1_get_ref_mv_from_stack
                 (int ref_idx,MV_REFERENCE_FRAME *ref_frame,int ref_mv_idx,
                 MB_MODE_INFO_EXT *mbmi_ext)

{
  char cVar1;
  int_mv *piVar2;
  char cVar3;
  char cVar4;
  int8_t ref_idx_1;
  long lVar5;
  
  cVar4 = *ref_frame;
  cVar1 = ref_frame[1];
  if ('\0' < cVar1) {
    cVar3 = -1;
    if (cVar1 < '\x05' || '\x04' < cVar4) {
      lVar5 = 0;
      do {
        if ((cVar4 == (&comp_ref0_lut)[lVar5]) && (cVar1 == (&comp_ref1_lut)[lVar5])) {
          cVar3 = (char)lVar5;
          break;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 9);
    }
    if (cVar3 < '\0') {
      cVar4 = cVar1 * '\x04' + cVar4 + -0xd;
    }
    else {
      cVar4 = cVar3 + '\x14';
    }
  }
  if (cVar1 < '\x01') {
    piVar2 = mbmi_ext->global_mvs + cVar4;
    if (ref_mv_idx < (int)(uint)mbmi_ext->ref_mv_count[cVar4]) {
      piVar2 = &mbmi_ext->ref_mv_stack[cVar4][ref_mv_idx].this_mv;
    }
  }
  else {
    piVar2 = &mbmi_ext->ref_mv_stack[cVar4][ref_mv_idx].comp_mv;
    if (ref_idx == 0) {
      piVar2 = &mbmi_ext->ref_mv_stack[cVar4][ref_mv_idx].this_mv;
    }
  }
  return (int_mv)(*piVar2).as_int;
}

Assistant:

static inline int8_t av1_ref_frame_type(const MV_REFERENCE_FRAME *const rf) {
  if (rf[1] > INTRA_FRAME) {
    const int8_t uni_comp_ref_idx = get_uni_comp_ref_idx(rf);
    if (uni_comp_ref_idx >= 0) {
      assert((REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx) <
             MODE_CTX_REF_FRAMES);
      return REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx;
    } else {
      return REF_FRAMES + FWD_RF_OFFSET(rf[0]) +
             BWD_RF_OFFSET(rf[1]) * FWD_REFS;
    }
  }

  return rf[0];
}